

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::ShowAxisMetrics(ImPlotAxis *axis,bool show_axis_rects)

{
  ImDrawList *this;
  char *pcVar1;
  ImDrawList *fg;
  bool show_axis_rects_local;
  ImPlotAxis *axis_local;
  
  ImGui::Bullet();
  ImGui::Text("Flags:      %d",(ulong)(uint)axis->Flags);
  ImGui::Bullet();
  ImGui::Text("Range:      [%f,%f]",(axis->Range).Min,(axis->Range).Max);
  ImGui::Bullet();
  ImGui::Text("Pixels:     %f",(double)axis->Pixels);
  ImGui::Bullet();
  ImPlotAxis::GetAspect(axis);
  ImGui::Text("Aspect:     %f");
  ImGui::Bullet();
  pcVar1 = "false";
  if ((axis->Dragging & 1U) != 0) {
    pcVar1 = "true";
  }
  ImGui::Text("Dragging:   %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if ((axis->ExtHovered & 1U) != 0) {
    pcVar1 = "true";
  }
  ImGui::Text("ExtHovered: %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if ((axis->AllHovered & 1U) != 0) {
    pcVar1 = "true";
  }
  ImGui::Text("AllHovered: %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if ((axis->Present & 1U) != 0) {
    pcVar1 = "true";
  }
  ImGui::Text("Present:    %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if ((axis->HasRange & 1U) != 0) {
    pcVar1 = "true";
  }
  ImGui::Text("HasRange:   %s",pcVar1);
  ImGui::Bullet();
  ImGui::Text("LinkedMin:  %p",axis->LinkedMin);
  ImGui::Bullet();
  ImGui::Text("LinkedMax:  %p",axis->LinkedMax);
  if (show_axis_rects) {
    this = ImGui::GetForegroundDrawList();
    ImDrawList::AddRect(this,&(axis->HoverRect).Min,&(axis->HoverRect).Max,0xff00ff00,0.0,0,1.0);
  }
  return;
}

Assistant:

void ShowAxisMetrics(ImPlotAxis* axis, bool show_axis_rects) {
    ImGui::Bullet(); ImGui::Text("Flags:      %d", axis->Flags);
    ImGui::Bullet(); ImGui::Text("Range:      [%f,%f]",axis->Range.Min, axis->Range.Max);
    ImGui::Bullet(); ImGui::Text("Pixels:     %f", axis->Pixels);
    ImGui::Bullet(); ImGui::Text("Aspect:     %f", axis->GetAspect());
    ImGui::Bullet(); ImGui::Text("Dragging:   %s", axis->Dragging ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("ExtHovered: %s", axis->ExtHovered ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("AllHovered: %s", axis->AllHovered ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("Present:    %s", axis->Present ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("HasRange:   %s", axis->HasRange ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("LinkedMin:  %p", (void*)axis->LinkedMin);
    ImGui::Bullet(); ImGui::Text("LinkedMax:  %p", (void*)axis->LinkedMax);
    if (show_axis_rects) {
        ImDrawList& fg = *ImGui::GetForegroundDrawList();
        fg.AddRect(axis->HoverRect.Min, axis->HoverRect.Max, IM_COL32(0,255,0,255));
    }
}